

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

void writeVTKfileFor2DintegerField(char *fileName,char *description,char **field,lattice *grid)

{
  FILE *__stream;
  double *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  int i_1;
  int j_1;
  double j;
  double i;
  FILE *vtkFile;
  int local_40;
  int local_3c;
  double local_38;
  double local_30;
  
  __stream = fopen(in_RDI,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"# vtk DataFile Version 3.0\n");
    fprintf(__stream,"Scalar Field\n");
    fprintf(__stream,"ASCII\n");
    fprintf(__stream,"DATASET RECTILINEAR_GRID\n");
    fprintf(__stream,"DIMENSIONS %d %d 1\n",(ulong)*(uint *)(in_RCX + 2),
            (ulong)*(uint *)((long)in_RCX + 0x14));
    fprintf(__stream,"X_COORDINATES %d double\n",(ulong)*(uint *)(in_RCX + 2));
    for (local_30 = 0.0; local_30 < (double)*(int *)(in_RCX + 2); local_30 = local_30 + 1.0) {
      fprintf(__stream,"%lf ",*in_RCX * local_30);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"Y_COORDINATES %d double\n",(ulong)*(uint *)((long)in_RCX + 0x14));
    for (local_38 = 0.0; local_38 < (double)*(int *)((long)in_RCX + 0x14); local_38 = local_38 + 1.0
        ) {
      fprintf(__stream,"%lf ",in_RCX[1] * local_38);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"Z_COORDINATES 1 double\n");
    fprintf(__stream,"0.0\n");
    fprintf(__stream,"POINT_DATA %d\n",
            (ulong)(uint)(*(int *)(in_RCX + 2) * *(int *)((long)in_RCX + 0x14)));
    fprintf(__stream,"SCALARS %s double 1\n",in_RSI);
    fprintf(__stream,"LOOKUP_TABLE default\n");
    for (local_3c = 0; local_3c < *(int *)((long)in_RCX + 0x24); local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < *(int *)(in_RCX + 4); local_40 = local_40 + 1) {
        fprintf(__stream,"%i\n",
                (ulong)(*(char *)(*(long *)(in_RDX + (long)local_40 * 8) + (long)local_3c) != '\x0f'
                       ));
      }
    }
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void writeVTKfileFor2DintegerField (const char* fileName, const char* description, char **field, lattice *grid)
{
	FILE* vtkFile = fopen(fileName, "w");
	if (vtkFile == NULL)
		return;

	fprintf(vtkFile, "# vtk DataFile Version 3.0\n");
	fprintf(vtkFile, "Scalar Field\n");
	fprintf(vtkFile, "ASCII\n");

	fprintf(vtkFile, "DATASET RECTILINEAR_GRID\n");
	fprintf(vtkFile, "DIMENSIONS %d %d 1\n", grid->imax, grid->jmax);
	fprintf(vtkFile, "X_COORDINATES %d double\n", grid->imax);
	for (REAL i = 0; i < grid->imax; i++)
		fprintf(vtkFile, "%lf ", grid->delx*i);
	fprintf(vtkFile, "\n");
	fprintf(vtkFile, "Y_COORDINATES %d double\n", grid->jmax);
	for (REAL j = 0; j < grid->jmax; j++)
		fprintf(vtkFile, "%lf ", grid->dely*j);
	fprintf(vtkFile, "\n");
	fprintf(vtkFile, "Z_COORDINATES 1 double\n");
	fprintf(vtkFile, "0.0\n");

	fprintf(vtkFile, "POINT_DATA %d\n", grid->imax * grid->jmax);
	fprintf(vtkFile, "SCALARS %s double 1\n", description);
	fprintf(vtkFile, "LOOKUP_TABLE default\n");
	for(int j = 0; j < grid->delj; j++)
	{
		for(int i = 0; i < grid->deli; i++)
		{
			fprintf(vtkFile, "%i\n", (field[i][j]!=C_F));
		}
	}
	fprintf(vtkFile,"\n");
	fclose(vtkFile);
	return;
}